

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O2

sz_sock sznet::net::sockets::sz_sock_create(int family)

{
  int iVar1;
  SourceFile file;
  Logger local_ff8;
  undefined1 local_28 [12];
  
  iVar1 = socket(family,1,6);
  if (iVar1 < 0) {
    Logger::SourceFile::SourceFile<101>
              ((SourceFile *)local_28,
               (char (*) [101])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_28._0_8_;
    file.m_size = local_28._8_4_;
    Logger::Logger(&local_ff8,file,0x14b,true);
    LogStream::operator<<(&local_ff8.m_impl.m_stream,"sockets::sz_sock_create");
    Logger::~Logger(&local_ff8);
  }
  return iVar1;
}

Assistant:

sz_sock sz_sock_create(int family)
{
	sz_sock sockfd = ::socket(family, SOCK_STREAM, IPPROTO_TCP);
	if (sockfd < 0)
	{
		LOG_SYSFATAL << "sockets::sz_sock_create";
	}

	return sockfd;
}